

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynarray.cpp
# Opt level: O3

DynArray * __thiscall DynArray::Copy(DynArray *this)

{
  uint uVar1;
  DynArray *this_00;
  char *__dest;
  
  this_00 = (DynArray *)operator_new(0x18);
  DynArray(this_00,this->elem_size);
  this_00->length = this->length;
  uVar1 = this->data_size;
  this_00->data_size = uVar1;
  __dest = (char *)malloc((ulong)(uVar1 * this->elem_size));
  free(this_00->data);
  memcpy(__dest,this->data,(ulong)(this->elem_size * this->length));
  this_00->data = __dest;
  return this_00;
}

Assistant:

DynArray *
DynArray::Copy()
{
  DynArray *new_array = new DynArray(elem_size);

  new_array->length = length;
  new_array->data_size = data_size;

  char *new_data;
  new_data = (char *)malloc(data_size * elem_size);
  free(new_array->data);
  memcpy(new_data, data, length * elem_size);
  new_array->data = new_data;

  return (new_array);
}